

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::_::HashSetCallbacks>::
find<kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char_const>&>
          (HashIndex<kj::_::HashSetCallbacks> *this,
          ArrayPtr<kj::ArrayPtr<const_unsigned_char>_> table,ArrayPtr<const_unsigned_char> *params)

{
  uchar *puVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar7;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar8;
  ArrayPtr<const_unsigned_char> *pAVar9;
  uint uVar10;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *in_R8;
  uint *puVar11;
  long lVar12;
  size_t sVar13;
  Maybe<unsigned_long> MVar14;
  
  aVar7.value = table.size_;
  pAVar9 = table.ptr;
  aVar8.value = aVar7.value;
  if (pAVar9[1].size_ != 0) {
    uVar3 = _::HashCoder::operator*
                      ((HashCoder *)&_::HASHCODER,*(ArrayPtr<const_unsigned_char> *)in_R8);
    uVar4 = _::chooseBucket((uint)(uVar3 != 0),(uint)pAVar9[1].size_);
    puVar1 = pAVar9[1].ptr;
    uVar5 = (ulong)uVar4;
    uVar10 = *(uint *)(puVar1 + uVar5 * 8 + 4);
    aVar8 = extraout_RDX;
    if (uVar10 != 0) {
      puVar11 = (uint *)(puVar1 + uVar5 * 8);
      aVar8 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)in_R8->value;
      sVar2 = in_R8[1].value;
      do {
        if ((uVar10 != 1) && (*puVar11 == (uint)(uVar3 != 0))) {
          lVar12 = (ulong)(uVar10 - 2) * 0x10;
          if (*(size_t *)(aVar7.value + 8 + lVar12) == sVar2) {
            if (sVar2 == 0) {
LAB_0019bd02:
              *(undefined1 *)this = 1;
              this->erasedCount = (ulong)(uVar10 - 2);
              goto LAB_0019bd09;
            }
            sVar13 = 0;
            while (*(char *)(*(long *)(lVar12 + aVar7.value) + sVar13) ==
                   *(char *)(aVar8.value + sVar13)) {
              sVar13 = sVar13 + 1;
              if (sVar2 == sVar13) goto LAB_0019bd02;
            }
          }
        }
        uVar6 = uVar5 + 1;
        uVar5 = 0;
        if (uVar6 != pAVar9[1].size_) {
          uVar5 = uVar6 & 0xffffffff;
        }
        puVar11 = (uint *)(puVar1 + uVar5 * 8);
        uVar10 = puVar11[1];
      } while (uVar10 != 0);
    }
  }
  *(undefined1 *)this = 0;
LAB_0019bd09:
  MVar14.ptr.field_1.value = aVar8.value;
  MVar14.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar14.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }